

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> * __thiscall
tinyusdz::GPrim::get_displayColors
          (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
           *__return_storage_ptr__,GPrim *this,double time,TimeSampleInterpolationType interp)

{
  bool bVar1;
  string err;
  GeomPrimvar primvar;
  allocator local_391;
  double local_390;
  string local_388;
  string local_368;
  GeomPrimvar local_348;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  local_390 = time;
  ::std::__cxx11::string::string((string *)&local_348,"displayColor",(allocator *)&local_368);
  bVar1 = has_primvar(this,&local_348._name);
  ::std::__cxx11::string::_M_dispose();
  if (bVar1) {
    GeomPrimvar::GeomPrimvar(&local_348);
    ::std::__cxx11::string::string((string *)&local_368,"displayColor",&local_391);
    bVar1 = get_primvar(this,&local_368,&local_348,&local_388);
    ::std::__cxx11::string::_M_dispose();
    if (bVar1) {
      GeomPrimvar::flatten_with_indices<tinyusdz::value::color3f>
                (&local_348,local_390,__return_storage_ptr__,interp,(string *)0x0);
    }
    GeomPrimvar::~GeomPrimvar(&local_348);
  }
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

const std::vector<value::color3f> GPrim::get_displayColors(
    double time, value::TimeSampleInterpolationType interp) const {
  std::vector<value::color3f> dst;

  std::string err;
  if (has_primvar("displayColor")) {
    GeomPrimvar primvar;
    if (!get_primvar("displayColor", &primvar, &err)) {
      return dst;
    }

    primvar.flatten_with_indices(time, &dst, interp);
  }

  return dst;
}